

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int m_encode_uncomp(aec_stream *strm)

{
  internal_state *state_00;
  int iVar1;
  aec_stream *in_RDI;
  internal_state *state;
  
  state_00 = in_RDI->state;
  emit(state_00,(1 << ((byte)state_00->id_len & 0x1f)) - 1,state_00->id_len);
  if (state_00->ref != 0) {
    *state_00->block = state_00->ref_sample;
  }
  emitblock(in_RDI,in_RDI->bits_per_sample,0);
  iVar1 = m_flush_block(in_RDI);
  return iVar1;
}

Assistant:

static int m_encode_uncomp(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    emit(state, (1U << state->id_len) - 1, state->id_len);
    if (state->ref)
        state->block[0] = state->ref_sample;
    emitblock(strm, strm->bits_per_sample, 0);
    return m_flush_block(strm);
}